

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VCloneEmpty_Serial(N_Vector w)

{
  int iVar1;
  undefined4 *puVar2;
  N_Vector in_RDI;
  N_VectorContent_Serial content;
  N_Vector v;
  N_Vector local_8;
  
  if (in_RDI == (N_Vector)0x0) {
    local_8 = (N_Vector)0x0;
  }
  else {
    local_8 = N_VNewEmpty((SUNContext)0x0);
    if (local_8 == (N_Vector)0x0) {
      local_8 = (N_Vector)0x0;
    }
    else {
      iVar1 = N_VCopyOps(in_RDI,local_8);
      if (iVar1 == 0) {
        puVar2 = (undefined4 *)malloc(0x10);
        if (puVar2 == (undefined4 *)0x0) {
          N_VDestroy((N_Vector)0xecd254);
          local_8 = (N_Vector)0x0;
        }
        else {
          local_8->content = puVar2;
          *puVar2 = *in_RDI->content;
          puVar2[1] = 0;
          *(undefined8 *)(puVar2 + 2) = 0;
        }
      }
      else {
        N_VDestroy((N_Vector)0xecd21f);
        local_8 = (N_Vector)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

N_Vector N_VCloneEmpty_Serial(N_Vector w)
{
  N_Vector v;
  N_VectorContent_Serial content;

  if (w == NULL) return(NULL);

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(w->sunctx);
  if (v == NULL) return(NULL);

  /* Attach operations */
  if (N_VCopyOps(w, v)) { N_VDestroy(v); return(NULL); }

  /* Create content */
  content = NULL;
  content = (N_VectorContent_Serial) malloc(sizeof *content);
  if (content == NULL) { N_VDestroy(v); return(NULL); }

  /* Attach content */
  v->content = content;

  /* Initialize content */
  content->length   = NV_LENGTH_S(w);
  content->own_data = SUNFALSE;
  content->data     = NULL;

  return(v);
}